

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_NtkIsPiBuffers(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjIsCi(p,iObj);
  if (iVar1 == 0) {
    iVar1 = Acb_ObjFaninNum(p,iObj);
    if (iVar1 == 1) {
      iVar1 = Acb_ObjFanin(p,iObj,0);
      p_local._4_4_ = Acb_NtkIsPiBuffers(p,iVar1);
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Acb_NtkIsPiBuffers( Acb_Ntk_t * p, int iObj )
{
    if ( Acb_ObjIsCi(p, iObj) )
        return 1;
    if ( Acb_ObjFaninNum(p, iObj) != 1 )
        return 0;
    return Acb_NtkIsPiBuffers( p, Acb_ObjFanin(p, iObj, 0) );
}